

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::EnumFieldGenerator::GenerateSerializationCode
          (EnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = ((this->super_FieldGenerator).params_)->generate_has_;
  if ((*(int *)(this->descriptor_ + 0x4c) == 2) && ((bVar1 & 1U) == 0)) {
    pcVar2 = "output.writeInt32($number$, this.$name$);\n";
  }
  else {
    pcVar2 = "if (this.$name$ != $default$) {\n";
    if ((bVar1 & 1U) != 0) {
      pcVar2 = "if (this.$name$ != $default$ || has$capitalized_name$) {\n";
    }
    io::Printer::Print(printer,&this->variables_,pcVar2);
    pcVar2 = "  output.writeInt32($number$, this.$name$);\n}\n";
  }
  io::Printer::Print(printer,&this->variables_,pcVar2);
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  if (descriptor_->is_required() && !params_.generate_has()) {
    // Always serialize a required field if we don't have the 'has' signal.
    printer->Print(variables_,
      "output.writeInt32($number$, this.$name$);\n");
  } else {
    if (params_.generate_has()) {
      printer->Print(variables_,
        "if (this.$name$ != $default$ || has$capitalized_name$) {\n");
    } else {
      printer->Print(variables_,
        "if (this.$name$ != $default$) {\n");
    }
    printer->Print(variables_,
      "  output.writeInt32($number$, this.$name$);\n"
      "}\n");
  }
}